

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O2

Quaternion * AML::dcm2Quat(Quaternion *__return_storage_ptr__,Matrix33 *dcm)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  
  bVar6 = isValidDCM(dcm,0.0001);
  if (bVar6) {
    dVar7 = (dcm->field_0).data[0][0];
    dVar9 = dVar7 + 1.0;
    dVar23 = (dcm->field_0).data[1][1];
    dVar8 = (dcm->field_0).data[2][2];
    dVar11 = dVar9 + dVar23 + dVar8;
    dVar10 = (dVar9 - dVar23) - dVar8;
    dVar7 = 1.0 - dVar7;
    dVar13 = (dVar7 + dVar23) - dVar8;
    dVar8 = (dVar7 - dVar23) + dVar8;
    dVar7 = (dcm->field_0).data[1][2];
    dVar23 = (dcm->field_0).data[2][1];
    dVar15 = (dcm->field_0).data[0][2];
    dVar5 = (dcm->field_0).data[1][0];
    dVar22 = dVar7 - dVar23;
    dVar9 = (dcm->field_0).data[0][1];
    dVar12 = (dcm->field_0).data[2][0];
    dVar14 = dVar12 - dVar15;
    dVar20 = dVar9 + dVar5;
    dVar15 = dVar15 + dVar12;
    dVar9 = dVar9 - dVar5;
    if (((dVar11 < dVar10) || (dVar11 < dVar13)) || (dVar11 < dVar8)) {
      if (((dVar10 < dVar11) || (dVar10 < dVar13)) || (dVar10 < dVar8)) {
        dVar7 = dVar7 + dVar23;
        if (((dVar13 < dVar11) || (dVar13 < dVar10)) || (dVar13 < dVar8)) {
          dVar12 = 0.0;
          dVar23 = 0.0;
          if ((dVar8 < dVar11) || (dVar8 < dVar10)) {
            auVar17 = ZEXT816(0);
          }
          else {
            auVar17 = ZEXT816(0);
            if (dVar13 <= dVar8) {
              if (dVar8 < 0.0) {
                dVar8 = sqrt(dVar8);
              }
              else {
                dVar8 = SQRT(dVar8);
              }
              auVar21._0_8_ = dVar9 * 0.5;
              auVar21._8_8_ = dVar15 * 0.5;
              auVar4._8_8_ = dVar8;
              auVar4._0_8_ = dVar8;
              auVar17 = divpd(auVar21,auVar4);
              dVar12 = auVar17._0_8_;
              dVar23 = auVar17._8_8_;
              auVar17._8_8_ = dVar8 * 0.5;
              auVar17._0_8_ = (dVar7 * 0.5) / dVar8;
            }
          }
        }
        else {
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          auVar19._0_8_ = dVar14 * 0.5;
          auVar19._8_8_ = dVar20 * 0.5;
          auVar3._8_8_ = dVar13;
          auVar3._0_8_ = dVar13;
          auVar17 = divpd(auVar19,auVar3);
          dVar12 = auVar17._0_8_;
          dVar23 = auVar17._8_8_;
          auVar17._8_8_ = (dVar7 * 0.5) / dVar13;
          auVar17._0_8_ = dVar13 * 0.5;
        }
      }
      else {
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar12 = (dVar22 * 0.5) / dVar10;
        dVar23 = dVar10 * 0.5;
        auVar18._0_8_ = dVar20 * 0.5;
        auVar18._8_8_ = dVar15 * 0.5;
        auVar2._8_8_ = dVar10;
        auVar2._0_8_ = dVar10;
        auVar17 = divpd(auVar18,auVar2);
      }
    }
    else {
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      dVar12 = dVar11 * 0.5;
      dVar23 = (dVar22 * 0.5) / dVar11;
      auVar16._0_8_ = dVar14 * 0.5;
      auVar16._8_8_ = dVar9 * 0.5;
      auVar1._8_8_ = dVar11;
      auVar1._0_8_ = dVar11;
      auVar17 = divpd(auVar16,auVar1);
    }
    (__return_storage_ptr__->field_0).data[0] = dVar12;
    (__return_storage_ptr__->field_0).data[1] = dVar23;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->field_0 + 0x10) = auVar17;
  }
  else {
    (__return_storage_ptr__->field_0).data[0] = 1.0;
    (__return_storage_ptr__->field_0).data[1] = 0.0;
    (__return_storage_ptr__->field_0).data[2] = 0.0;
    (__return_storage_ptr__->field_0).data[3] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Quaternion dcm2Quat(const Matrix33& dcm)
    {
        const double TOL = 0.0001;

        // Check if DCM is Valid
        if (isValidDCM(dcm, TOL))
        {
            double q0 = 0.0;
            double q1 = 0.0;
            double q2 = 0.0;
            double q3 = 0.0;
            const double x4q0_2 = (1.0 + dcm.m11 + dcm.m22 + dcm.m33);
            const double x4q1_2 = (1.0 + dcm.m11 - dcm.m22 - dcm.m33);
            const double x4q2_2 = (1.0 - dcm.m11 + dcm.m22 - dcm.m33);
            const double x4q3_2 = (1.0 - dcm.m11 - dcm.m22 + dcm.m33);
            const double x4q2q3 = dcm.m23 + dcm.m32;
            const double x4q1q3 = dcm.m31 + dcm.m13;
            const double x4q1q2 = dcm.m12 + dcm.m21;
            const double x4q0q1 = dcm.m23 - dcm.m32;
            const double x4q0q2 = dcm.m31 - dcm.m13;
            const double x4q0q3 = dcm.m12 - dcm.m21;

            // Check which Trace is Largest
            if (x4q0_2 >= x4q1_2 && x4q0_2 >= x4q2_2 && x4q0_2 >= x4q3_2) // 4q0_2 Largest
            {
                const double x2q0 = sqrt(x4q0_2);
                q0 = 0.5 * x2q0;
                q1 = 0.5 * x4q0q1 / x2q0;
                q2 = 0.5 * x4q0q2 / x2q0;
                q3 = 0.5 * x4q0q3 / x2q0;
            }
            else if (x4q1_2 >= x4q0_2 && x4q1_2 >= x4q2_2 && x4q1_2 >= x4q3_2) // 4q1_2 Largest
            {
                const double x2q1 = sqrt(x4q1_2);
                q0 = 0.5 * x4q0q1 / x2q1;
                q1 = 0.5 * x2q1;
                q2 = 0.5 * x4q1q2 / x2q1;
                q3 = 0.5 * x4q1q3 / x2q1;
            }
            else if (x4q2_2 >= x4q0_2 && x4q2_2 >= x4q1_2 && x4q2_2 >= x4q3_2) // 4q2_2 Largest
            {
                const double x2q2 = sqrt(x4q2_2);
                q0 = 0.5 * x4q0q2 / x2q2;
                q1 = 0.5 * x4q1q2 / x2q2;
                q2 = 0.5 * x2q2;
                q3 = 0.5 * x4q2q3 / x2q2;
            }
            else if (x4q3_2 >= x4q0_2 && x4q3_2 >= x4q1_2 && x4q3_2 >= x4q2_2) // 4q3_2 Largest
            {
                const double x2q3 = sqrt(x4q3_2);
                q0 = 0.5 * x4q0q3 / x2q3;
                q1 = 0.5 * x4q1q3 / x2q3;
                q2 = 0.5 * x4q2q3 / x2q3;
                q3 = 0.5 * x2q3;
            }
            return Quaternion(q0, q1, q2, q3);
        }
        return Quaternion::identity();
    }